

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

UBool __thiscall icu_63::UnicodeSet::operator==(UnicodeSet *this,UnicodeSet *o)

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  UBool UVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar2 = this->len;
  if (uVar2 != o->len) {
    return '\0';
  }
  bVar7 = 0 < (int)uVar2;
  if (0 < (int)uVar2) {
    if (*this->list == *o->list) {
      uVar6 = 0;
      do {
        if ((ulong)uVar2 - 1 == uVar6) goto LAB_002e84c7;
        lVar3 = uVar6 + 1;
        uVar1 = uVar6 + 1;
        lVar4 = uVar6 + 1;
        uVar6 = uVar1;
      } while (this->list[lVar3] == o->list[lVar4]);
      bVar7 = uVar1 < uVar2;
    }
    if (bVar7) {
      return '\0';
    }
  }
LAB_002e84c7:
  UVar5 = UVector::operator==(this->strings,o->strings);
  return UVar5 != '\0';
}

Assistant:

UBool UnicodeSet::operator==(const UnicodeSet& o) const {
    if (len != o.len) return FALSE;
    for (int32_t i = 0; i < len; ++i) {
        if (list[i] != o.list[i]) return FALSE;
    }
    if (*strings != *o.strings) return FALSE;
    return TRUE;
}